

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

pos_type __thiscall
lrit::anon_unknown_0::offsetfilebuf::seekoff
          (offsetfilebuf *this,off_type off,seekdir dir,openmode which)

{
  _Ios_Openmode _Var1;
  _Ios_Seekdir _Var2;
  undefined1 auVar3 [16];
  pos_type pVar4;
  
  _Var2 = (_Ios_Seekdir)off;
  if (dir == _S_beg) {
    _Var2 = _Var2 + (int)this->offset_;
    _Var1 = ~(_S_ios_openmode_min|_S_ios_openmode_max);
  }
  else if (dir == _S_end) {
    _Var1 = _S_ate;
  }
  else {
    if (dir != _S_cur) {
      auVar3 = ZEXT816(0);
      goto LAB_0010cf39;
    }
    _Var1 = _S_app;
  }
  auVar3 = std::filebuf::seekoff((long)this,_Var2,_Var1);
LAB_0010cf39:
  pVar4._M_state = auVar3._8_8_;
  pVar4._M_off = auVar3._0_8_ - this->offset_;
  return pVar4;
}

Assistant:

pos_type seekoff(
      off_type off,
      std::ios_base::seekdir dir,
      std::ios_base::openmode which = std::ios_base::in) override {
    pos_type pos = 0;
    if (dir == std::ios_base::cur) {
      pos = std::filebuf::seekoff(off, dir, which);
    } else if (dir == std::ios_base::end) {
      pos = std::filebuf::seekoff(off, dir, which);
    } else if (dir == std::ios_base::beg) {
      pos = std::filebuf::seekoff(off + offset_, dir, which);
    }
    return pos - offset_;
  }